

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall OpenMesh::PropertyT<int>::PropertyT(PropertyT<int> *this,PropertyT<int> *_rhs)

{
  pointer pcVar1;
  
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__BaseProperty_001c3cc0;
  (this->super_BaseProperty).name_._M_dataplus._M_p =
       (pointer)&(this->super_BaseProperty).name_.field_2;
  pcVar1 = (_rhs->super_BaseProperty).name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_BaseProperty).name_,pcVar1,
             pcVar1 + (_rhs->super_BaseProperty).name_._M_string_length);
  (this->super_BaseProperty).persistent_ = (_rhs->super_BaseProperty).persistent_;
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_001c3438;
  std::vector<int,_std::allocator<int>_>::vector(&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}